

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolarizableAdapter.cpp
# Opt level: O0

PolarizableAtypeParameters __thiscall
OpenMD::PolarizableAdapter::getPolarizableParam(PolarizableAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  PolarizableAtypeParameters *pPVar3;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> polData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff40;
  errorStruct *peVar4;
  AtomType *in_stack_ffffffffffffff48;
  string local_a0 [64];
  undefined1 local_60 [88];
  pointer local_8;
  
  bVar1 = isPolarizable((PolarizableAdapter *)0x2cfb91);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "PolarizableAdapter::getPolarizableParam was passed an atomType (%s)\n\tthat does not appear to be a polarizable atom.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)(local_60 + 0x30));
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff48 = (AtomType *)local_60;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "PolarizableAdapter::getPolarizableParam could not find polarizable\n\tparameters for atomType %s.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff48);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> *
                          )in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    peVar4 = &painCave;
    snprintf(painCave.errMsg,2000,
             "PolarizableAdapter::getPolarizableParam could not convert\n\tGenericData to PolarizableAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(local_a0);
    peVar4->severity = 1;
    peVar4->isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2cfd80);
  pPVar3 = SimpleTypeData<OpenMD::PolarizableAtypeParameters>::getData(this_00);
  local_8 = (pointer)pPVar3->polarizability;
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::PolarizableAtypeParameters>_> *)0x2cfda9);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2cfdb6);
  return (PolarizableAtypeParameters)(RealType)local_8;
}

Assistant:

PolarizableAtypeParameters PolarizableAdapter::getPolarizableParam() {
    if (!isPolarizable()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAdapter::getPolarizableParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a polarizable atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(PolTypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "PolarizableAdapter::getPolarizableParam could not find polarizable\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<PolarizableAtypeData> polData =
        std::dynamic_pointer_cast<PolarizableAtypeData>(data);
    if (polData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PolarizableAdapter::getPolarizableParam could not convert\n"
               "\tGenericData to PolarizableAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return polData->getData();
  }